

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_subset(bcf_hdr_t *h,bcf1_t *v,int n,int *imap)

{
  byte bVar1;
  int32_t x;
  int iVar2;
  int type;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  size_t __size;
  ulong uVar11;
  char *pcVar12;
  uint *puVar13;
  uint8_t *ptr_start;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  size_t __n;
  ulong uVar17;
  undefined8 uStack_80;
  ulong local_78;
  bcf1_t *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  kstring_t local_58;
  int local_34;
  
  puVar10 = &local_78;
  local_58.l = 0;
  local_58.m = 0;
  local_58.s = (char *)0x0;
  uVar17 = *(ulong *)&v->field_0x10;
  local_34 = n;
  if (n == 0) {
    uVar17 = uVar17 & 0xffffffffff;
  }
  else {
    lVar4 = -(ulong)((uint)(uVar17 >> 0x1b) & 0x1fe0);
    puVar10 = (ulong *)((long)&local_78 + lVar4);
    if ((uVar17 & 0xff00000000) != 0) {
      pbVar16 = (byte *)(v->indiv).s;
      uVar11 = uVar17 >> 0x20 & 0xff;
      puVar13 = (uint *)((long)&local_60 + lVar4 + 4);
      do {
        if ((*pbVar16 & 0xf) == 2) {
          pbVar14 = pbVar16 + 3;
          uVar6 = (uint)*(short *)(pbVar16 + 1);
        }
        else if ((*pbVar16 & 0xf) == 1) {
          pbVar14 = pbVar16 + 2;
          uVar6 = (uint)(char)pbVar16[1];
        }
        else {
          pbVar14 = pbVar16 + 5;
          uVar6 = *(uint *)(pbVar16 + 1);
        }
        puVar13[-7] = uVar6;
        bVar1 = *pbVar14;
        puVar13[-4] = bVar1 & 0xf;
        if (*pbVar14 < 0xf0) {
          pbVar15 = pbVar14 + 1;
          uVar6 = (uint)(*pbVar14 >> 4);
        }
        else if ((pbVar14[1] & 0xf) == 2) {
          uVar6 = (uint)*(short *)(pbVar14 + 2);
          pbVar15 = pbVar14 + 4;
        }
        else if ((pbVar14[1] & 0xf) == 1) {
          uVar6 = (uint)(char)pbVar14[2];
          pbVar15 = pbVar14 + 3;
        }
        else {
          uVar6 = *(uint *)(pbVar14 + 2);
          pbVar15 = pbVar14 + 6;
        }
        puVar13[-6] = uVar6;
        uVar6 = uVar6 << (bcf_type_shift[bVar1 & 0xf] & 0x1f);
        puVar13[-5] = uVar6;
        *(byte **)(puVar13 + -3) = pbVar15;
        *puVar13 = (int)pbVar15 - (int)pbVar16 & 0x7fffffff;
        uVar6 = uVar6 * (uint)(uVar17 >> 0x28);
        pbVar16 = pbVar15 + (int)uVar6;
        puVar13[-1] = uVar6;
        puVar13 = puVar13 + 8;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    local_68 = (undefined1 *)puVar10;
    local_60 = imap;
    if ((uVar17 & 0xff00000000) != 0) {
      uVar11 = 0;
      local_70 = v;
      do {
        puVar5 = local_68;
        lVar9 = uVar11 * 0x20;
        x = *(int32_t *)(local_68 + lVar9);
        local_78 = uVar11;
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11f094;
        bcf_enc_int1(&local_58,x);
        iVar2 = *(int *)(puVar5 + lVar9 + 4);
        type = *(int *)(puVar5 + lVar9 + 0xc);
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11f0a6;
        bcf_enc_size(&local_58,iVar2,type);
        puVar5 = local_68;
        if (0 < local_34) {
          uVar17 = 0;
          piVar7 = local_60;
          do {
            pcVar12 = local_58.s;
            iVar2 = piVar7[uVar17];
            if (-1 < (long)iVar2) {
              __n = (size_t)*(int *)(puVar5 + lVar9 + 8);
              lVar3 = *(long *)(puVar5 + lVar9 + 0x10);
              uVar11 = local_58.l + __n + 1;
              if (local_58.m <= uVar11) {
                uVar11 = uVar11 >> 1 | uVar11;
                uVar11 = uVar11 >> 2 | uVar11;
                uVar11 = uVar11 >> 4 | uVar11;
                uVar11 = uVar11 >> 8 | uVar11;
                __size = (uVar11 >> 0x10 | uVar11) + 1;
                local_58.m = __size;
                *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11f12c;
                pcVar12 = (char *)realloc(pcVar12,__size);
                piVar7 = local_60;
                if (pcVar12 == (char *)0x0) goto LAB_0011f160;
              }
              local_58.s = pcVar12;
              pcVar12 = local_58.s + local_58.l;
              *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11f14b;
              memcpy(pcVar12,(void *)((long)iVar2 * __n + lVar3),__n);
              local_58.l = __n + local_58.l;
              local_58.s[local_58.l] = '\0';
              piVar7 = local_60;
            }
LAB_0011f160:
            uVar17 = uVar17 + 1;
          } while ((uint)n != uVar17);
        }
        uVar11 = local_78 + 1;
        uVar17 = *(ulong *)&local_70->field_0x10;
        v = local_70;
      } while (uVar11 < (uVar17 >> 0x20 & 0xff));
    }
    uVar11 = 0;
    if (0 < local_34) {
      uVar8 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar11 - (~local_60[uVar8] >> 0x1f));
        uVar8 = uVar8 + 1;
      } while ((uint)n != uVar8);
      uVar11 = uVar11 << 0x28;
    }
    uVar17 = uVar17 & 0xffffffffff | uVar11;
    *(ulong *)&v->field_0x10 = uVar17;
    if (uVar11 != 0) goto LAB_0011f1e0;
  }
  *(ulong *)&v->field_0x10 = uVar17 & 0xffffffff;
LAB_0011f1e0:
  pcVar12 = (v->indiv).s;
  *(undefined8 *)((long)puVar10 + -8) = 0x11f1e9;
  free(pcVar12);
  (v->indiv).s = local_58.s;
  (v->indiv).l = local_58.l;
  (v->indiv).m = local_58.m;
  *(byte *)&v->unpacked = (byte)v->unpacked & 0xf7;
  return 0;
}

Assistant:

int bcf_subset(const bcf_hdr_t *h, bcf1_t *v, int n, int *imap)
{
    kstring_t ind;
    ind.s = 0; ind.l = ind.m = 0;
    if (n) {
        bcf_fmt_t *fmt;
        int i, j;
        fmt = (bcf_fmt_t*)alloca(v->n_fmt * sizeof(bcf_fmt_t));
        uint8_t *ptr = (uint8_t*)v->indiv.s;
        for (i = 0; i < v->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, v->n_sample, &fmt[i]);
        for (i = 0; i < (int)v->n_fmt; ++i) {
            bcf_fmt_t *f = &fmt[i];
            bcf_enc_int1(&ind, f->id);
            bcf_enc_size(&ind, f->n, f->type);
            for (j = 0; j < n; ++j)
                if (imap[j] >= 0) kputsn((char*)(f->p + imap[j] * f->size), f->size, &ind);
        }
        for (i = j = 0; j < n; ++j) if (imap[j] >= 0) ++i;
        v->n_sample = i;
    } else v->n_sample = 0;
    if ( !v->n_sample ) v->n_fmt = 0;
    free(v->indiv.s);
    v->indiv = ind;
    v->unpacked &= ~BCF_UN_FMT;    // only BCF is ready for output, VCF will need to unpack again
    return 0;
}